

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error.h
# Opt level: O1

double __thiscall nodecpp::error::std_error_domain::log(std_error_domain *this,double __x)

{
  bool bVar1;
  LogLevel in_ECX;
  Log *in_RDX;
  long in_RSI;
  char *pcVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  char local_40 [8];
  char *local_38;
  ModuleID local_30;
  
  bVar1 = impl::isDataStackInfo((StackInfo *)(in_RSI + 8));
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_40,this);
    pcVar2 = "";
    if (local_38 != (char *)0x0) {
      pcVar2 = local_38;
    }
    local_30.str = (char *)0x0;
    nodecpp::log::Log::log<char_const*,char_const*>(in_RDX,&local_30,in_ECX,"{} happened at",pcVar2)
    ;
    dVar3 = extraout_XMM0_Qa;
    if ((local_40[0] == '\0') && (local_38 != (char *)0x0)) {
      free(local_38);
      local_38 = (char *)0x0;
      dVar3 = extraout_XMM0_Qa_00;
    }
    dVar3 = StackInfo::log((StackInfo *)(in_RSI + 8),dVar3);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_40,this);
    pcVar2 = "";
    if (local_38 != (char *)0x0) {
      pcVar2 = local_38;
    }
    local_30.str = (char *)0x0;
    nodecpp::log::Log::log<char_const*,char_const*>(in_RDX,&local_30,in_ECX,"{}",pcVar2);
    dVar3 = extraout_XMM0_Qa_01;
    if ((local_40[0] == '\0') && (local_38 != (char *)0x0)) {
      free(local_38);
      dVar3 = extraout_XMM0_Qa_02;
    }
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::Log& targetLog, log::LogLevel l ) const {
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				targetLog.log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( targetLog, l );
			}
			else
				targetLog.log( l, "{}", value_to_message( value ).c_str() );
		}